

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O2

TestSuite * __thiscall
iutest::UnitTestImpl::AddTestSuite<iutest::TestSuite>
          (UnitTestImpl *this,string *testsuite_name,TestTypeId id,SetUpMethod setup,
          TearDownMethod teardown)

{
  TestSuite *this_00;
  TestSuite *local_38;
  
  local_38 = FindTestSuite(this,testsuite_name,id);
  if (local_38 == (TestSuite *)0x0) {
    this_00 = (TestSuite *)operator_new(0xb0);
    TestSuite::TestSuite(this_00,testsuite_name,id,setup,teardown);
    local_38 = this_00;
    std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::push_back
              (&this->m_testsuites,&local_38);
  }
  return local_38;
}

Assistant:

TestSuite* AddTestSuite(const ::std::string& testsuite_name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        TestSuite* p = FindTestSuite(testsuite_name, id);
        if( p == NULL )
        {
            p = new T (testsuite_name, id, setup, teardown);
            m_testsuites.push_back(p);
        }
        return p;
    }